

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O3

void amrex::WriteMultiLevelPlotfileHeaders
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  pointer pbVar1;
  pointer pcVar2;
  MultiFab *pMVar3;
  FabArray<amrex::FArrayBox> *mf_00;
  pointer pBVar4;
  long *plVar5;
  void *__s;
  size_type *psVar6;
  long lVar7;
  value_type *__val;
  pointer pbVar8;
  long lVar9;
  long lVar10;
  undefined4 in_register_00000034;
  string *psVar11;
  BoxArray *pBVar12;
  undefined8 *puVar13;
  ulong uVar14;
  byte bVar15;
  allocator_type local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  string ed;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  bVar15 = 0;
  PreBuildDirectorHierarchy
            (plotfilename,(string *)CONCAT44(in_register_00000034,nlevels),nlevels,false);
  pbVar8 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar1) {
    do {
      pcVar2 = (plotfilename->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar2,pcVar2 + plotfilename->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      psVar11 = (string *)(pbVar8->_M_dataplus)._M_p;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&__str,(ulong)psVar11);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        ed.field_2._M_allocated_capacity = *psVar6;
        ed.field_2._8_8_ = plVar5[3];
        ed._M_dataplus._M_p = (pointer)&ed.field_2;
      }
      else {
        ed.field_2._M_allocated_capacity = *psVar6;
        ed._M_dataplus._M_p = (pointer)*plVar5;
      }
      ed._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        psVar11 = (string *)(__str.field_2._M_allocated_capacity + 1);
        operator_delete(__str._M_dataplus._M_p,(ulong)psVar11);
      }
      PreBuildDirectorHierarchy(&ed,psVar11,nlevels,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ed._M_dataplus._M_p != &ed.field_2) {
        operator_delete(ed._M_dataplus._M_p,ed.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar1);
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    __s = operator_new(0x200000);
    memset(__s,0,0x200000);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar2 = (plotfilename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + plotfilename->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    std::ofstream::ofstream(&ed);
    (**(code **)(ed._M_string_length + 0x18))(&ed._M_string_length,__s,0x200000);
    std::ofstream::open((char *)&ed,(_Ios_Openmode)__str._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(long *)(ed._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(&__str);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)nlevels,&local_299);
    if (boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_start &&
        -1 < (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      lVar9 = 0x50;
      lVar10 = 0;
      do {
        pBVar4 = boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar3 = (mf->
                 super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar10];
        pBVar12 = (BoxArray *)
                  ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8);
        puVar13 = (undefined8 *)
                  ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar9 + -0x50);
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar13 = *(undefined8 *)&pBVar12->m_bat;
          pBVar12 = (BoxArray *)((long)pBVar12 + ((ulong)bVar15 * -2 + 1) * 8);
          puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
        }
        *(element_type **)
         ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9 + -8) =
             (((shared_ptr<amrex::BARef> *)
              ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x50))->
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((boxArrays.
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar9),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x58));
        *(element_type **)((long)&(pBVar4->m_bat).m_op + lVar9 + 4) =
             (((shared_ptr<amrex::BoxList> *)
              ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x60))->
             super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pBVar4->m_bat).m_op + lVar9 + 0xc),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x68));
        lVar10 = lVar10 + 1;
        lVar7 = ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar9 = lVar9 + 0x68;
      } while (lVar7 - lVar10 != 0 && lVar10 <= lVar7);
    }
    WriteGenericPlotfileHeader
              ((ostream *)&ed,nlevels,&boxArrays,varnames,geom,time,level_steps,ref_ratio,
               versionName,levelPrefix,mfPrefix);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
    ed._M_dataplus._M_p = _VTT;
    *(undefined8 *)((long)aiStack_210 + *(long *)(_VTT + -0x18) + -0x20) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&ed._M_string_length);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    operator_delete(__s,0x200000);
  }
  if (0 < nlevels) {
    uVar14 = 0;
    do {
      mf_00 = &(mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
               .
               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14]->super_FabArray<amrex::FArrayBox>;
      MultiFabFileFullPrefix(&ed,(int)uVar14,plotfilename,levelPrefix,mfPrefix);
      VisMF::WriteOnlyHeader(mf_00,&ed,NFiles);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ed._M_dataplus._M_p != &ed.field_2) {
        operator_delete(ed._M_dataplus._M_p,ed.field_2._M_allocated_capacity + 1);
      }
      uVar14 = uVar14 + 1;
    } while ((uint)nlevels != uVar14);
  }
  return;
}

Assistant:

void
WriteMultiLevelPlotfileHeaders (const std::string & plotfilename, int nlevels,
                                const Vector<const MultiFab*> & mf,
                                const Vector<std::string>     & varnames,
                                const Vector<Geometry>        & geom,
                                Real time, const Vector<int>  & level_steps,
                                const Vector<IntVect>     & ref_ratio,
                                const std::string         & versionName,
                                const std::string         & levelPrefix,
                                const std::string         & mfPrefix,
                                const Vector<std::string> & extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    int finest_level = nlevels-1;

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, varnames,
                                   geom, time, level_steps, ref_ratio, versionName, levelPrefix, mfPrefix);
    }

    for (int level = 0; level <= finest_level; ++level) {
        const MultiFab * data;
        data = mf[level];
        VisMF::WriteOnlyHeader(*data, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

}